

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O1

void __thiscall OpenMD::DirectionalAtom::setPrevA(DirectionalAtom *this,RotMat3x3d *a)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  double (*padVar4) [3];
  double *pdVar5;
  uint i;
  long lVar6;
  uint j_2;
  double (*padVar7) [3];
  long lVar8;
  double *pdVar9;
  Mat3x3d *pMVar10;
  uint j_3;
  uint k_1;
  Mat3x3d *pMVar11;
  uint k;
  long lVar12;
  double dVar13;
  Vector<double,_3U> result_1;
  SquareMatrix3<double> result_2;
  RotMat3x3d atrans;
  double local_f8 [10];
  double local_a8 [10];
  double local_58 [9];
  
  padVar4 = (double (*) [3])
            ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
            *(long *)((long)&(((this->super_Atom).super_StuntDouble.snapshotMan_)->previousSnapshot_
                             ->atomData).aMat.
                             super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                     (this->super_Atom).super_StuntDouble.storage_));
  if ((RotMat3x3d *)padVar4 != a) {
    lVar6 = 0;
    padVar7 = (double (*) [3])a;
    do {
      lVar8 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar4)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar8] =
             (((SquareMatrix<double,_3> *)*padVar7)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar6 = lVar6 + 1;
      padVar4 = padVar4 + 1;
      padVar7 = padVar7 + 1;
    } while (lVar6 != 3);
  }
  bVar3 = AtomType::isMultipole((this->super_Atom).atomType_);
  if (bVar3) {
    pdVar5 = local_58;
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[4] = 0.0;
    local_58[5] = 0.0;
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    local_58[8] = 0.0;
    lVar6 = 0;
    padVar4 = (double (*) [3])a;
    do {
      lVar8 = 0;
      pdVar9 = pdVar5;
      do {
        *pdVar9 = (((SquareMatrix<double,_3> *)*padVar4)->super_RectMatrix<double,_3U,_3U>).data_[0]
                  [lVar8];
        lVar8 = lVar8 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar8 != 3);
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + 1;
      padVar4 = padVar4 + 1;
    } while (lVar6 != 3);
    bVar3 = AtomType::isDipole((this->super_Atom).atomType_);
    if (bVar3) {
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[2] = 0.0;
      pdVar5 = local_58;
      lVar6 = 0;
      do {
        dVar13 = local_f8[lVar6];
        lVar8 = 0;
        do {
          dVar13 = dVar13 + pdVar5[lVar8] * (this->dipole_).super_Vector<double,_3U>.data_[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        local_f8[lVar6] = dVar13;
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar6 != 3);
      lVar8 = (long)(this->super_Atom).super_StuntDouble.localIndex_;
      lVar6 = *(long *)((long)&(((this->super_Atom).super_StuntDouble.snapshotMan_)->
                                previousSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                       (this->super_Atom).super_StuntDouble.storage_);
      *(double *)(lVar6 + 0x10 + lVar8 * 0x18) = local_f8[2];
      pdVar5 = (double *)(lVar6 + lVar8 * 0x18);
      *pdVar5 = local_f8[0];
      pdVar5[1] = local_f8[1];
    }
    bVar3 = AtomType::isQuadrupole((this->super_Atom).atomType_);
    if (bVar3) {
      local_a8[6] = 0.0;
      local_a8[7] = 0.0;
      local_a8[4] = 0.0;
      local_a8[5] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[8] = 0.0;
      pdVar5 = local_58;
      lVar6 = 0;
      do {
        lVar8 = 0;
        pMVar10 = &this->quadrupole_;
        do {
          dVar13 = local_a8[lVar6 * 3 + lVar8];
          lVar12 = 0;
          pMVar11 = pMVar10;
          do {
            dVar13 = dVar13 + pdVar5[lVar12] *
                              (pMVar11->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][0];
            lVar12 = lVar12 + 1;
            pMVar11 = (Mat3x3d *)
                      ((pMVar11->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 1);
          } while (lVar12 != 3);
          local_a8[lVar6 * 3 + lVar8] = dVar13;
          lVar8 = lVar8 + 1;
          pMVar10 = (Mat3x3d *)
                    ((pMVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [0] + 1);
        } while (lVar8 != 3);
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar6 != 3);
      local_f8[6] = 0.0;
      local_f8[7] = 0.0;
      local_f8[4] = 0.0;
      local_f8[5] = 0.0;
      local_f8[2] = 0.0;
      local_f8[3] = 0.0;
      local_f8[0] = 0.0;
      local_f8[1] = 0.0;
      local_f8[8] = 0.0;
      pdVar5 = local_a8;
      lVar6 = 0;
      do {
        lVar8 = 0;
        padVar4 = (double (*) [3])a;
        do {
          dVar13 = local_f8[lVar6 * 3 + lVar8];
          lVar12 = 0;
          padVar7 = padVar4;
          do {
            dVar13 = dVar13 + pdVar5[lVar12] *
                              (((SquareMatrix<double,_3> *)*padVar7)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][0];
            lVar12 = lVar12 + 1;
            padVar7 = padVar7 + 1;
          } while (lVar12 != 3);
          local_f8[lVar6 * 3 + lVar8] = dVar13;
          lVar8 = lVar8 + 1;
          padVar4 = (double (*) [3])(*padVar4 + 1);
        } while (lVar8 != 3);
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar6 != 3);
      lVar6 = (long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
              *(long *)((long)&(((this->super_Atom).super_StuntDouble.snapshotMan_)->
                                previousSnapshot_->atomData).quadrupole.
                               super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                       (this->super_Atom).super_StuntDouble.storage_);
      lVar8 = 0;
      do {
        *(undefined8 *)(lVar6 + 0x10 + lVar8) = *(undefined8 *)((long)local_f8 + lVar8 + 0x10);
        uVar2 = *(undefined8 *)((long)local_f8 + lVar8 + 8);
        puVar1 = (undefined8 *)(lVar6 + lVar8);
        *puVar1 = *(undefined8 *)((long)local_f8 + lVar8);
        puVar1[1] = uVar2;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x48);
    }
  }
  return;
}

Assistant:

void DirectionalAtom::setPrevA(const RotMat3x3d& a) {
    ((snapshotMan_->getPrevSnapshot())->*storage_).aMat[localIndex_] = a;

    if (atomType_->isMultipole()) {
      RotMat3x3d atrans = a.transpose();

      if (atomType_->isDipole()) {
        ((snapshotMan_->getPrevSnapshot())->*storage_).dipole[localIndex_] =
            atrans * dipole_;
      }

      if (atomType_->isQuadrupole()) {
        ((snapshotMan_->getPrevSnapshot())->*storage_).quadrupole[localIndex_] =
            atrans * quadrupole_ * a;
      }
    }
  }